

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreePrevious(BtCursor *pCur,int *pRes)

{
  int iVar1;
  MemPage *pMVar2;
  byte bVar3;
  int iVar4;
  u32 newPgno;
  int iVar5;
  short sVar6;
  int iVar7;
  
  bVar3 = pCur->eState;
  if (1 < bVar3) {
    iVar4 = btreeRestoreCursorPosition(pCur);
    if (iVar4 != 0) {
      return iVar4;
    }
    bVar3 = pCur->eState;
  }
  pCur->atLast = '\0';
  iVar4 = 1;
  if (bVar3 == 0) {
    iVar7 = 0;
  }
  else {
    iVar1 = pCur->skipNext;
    pCur->skipNext = 0;
    iVar5 = 0;
    iVar7 = 0;
    if (-1 < iVar1) {
      sVar6 = pCur->iPage;
      pMVar2 = pCur->apPage[sVar6];
      if (pMVar2->leaf == '\0') {
        newPgno = sqlite3Get4byte(pMVar2->aData +
                                  (CONCAT11(pMVar2->aCellIdx[(ulong)pCur->aiIdx[sVar6] * 2],
                                            pMVar2->aCellIdx[(ulong)pCur->aiIdx[sVar6] * 2 + 1]) &
                                  pMVar2->maskPage));
        iVar4 = moveToChild(pCur,newPgno);
        if (iVar4 != 0) {
          return iVar4;
        }
        iVar5 = moveToRightmost(pCur);
      }
      else {
        while (pCur->aiIdx[sVar6] == 0) {
          if (sVar6 == 0) {
            pCur->eState = '\0';
            goto LAB_001556ec;
          }
          moveToParent(pCur);
          sVar6 = pCur->iPage;
        }
        (pCur->info).nSize = 0;
        pCur->validNKey = '\0';
        pCur->aiIdx[sVar6] = pCur->aiIdx[sVar6] - 1;
        if ((pCur->apPage[pCur->iPage]->intKey != '\0') && (pCur->apPage[pCur->iPage]->leaf == '\0')
           ) {
          iVar5 = sqlite3BtreePrevious(pCur,pRes);
        }
      }
    }
    iVar7 = iVar5;
    iVar4 = 0;
  }
LAB_001556ec:
  *pRes = iVar4;
  return iVar7;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreePrevious(BtCursor *pCur, int *pRes){
  int rc;
  MemPage *pPage;

  assert( cursorHoldsMutex(pCur) );
  rc = restoreCursorPosition(pCur);
  if( rc!=SQLITE_OK ){
    return rc;
  }
  pCur->atLast = 0;
  if( CURSOR_INVALID==pCur->eState ){
    *pRes = 1;
    return SQLITE_OK;
  }
  if( pCur->skipNext<0 ){
    pCur->skipNext = 0;
    *pRes = 0;
    return SQLITE_OK;
  }
  pCur->skipNext = 0;

  pPage = pCur->apPage[pCur->iPage];
  assert( pPage->isInit );
  if( !pPage->leaf ){
    int idx = pCur->aiIdx[pCur->iPage];
    rc = moveToChild(pCur, get4byte(findCell(pPage, idx)));
    if( rc ){
      return rc;
    }
    rc = moveToRightmost(pCur);
  }else{
    while( pCur->aiIdx[pCur->iPage]==0 ){
      if( pCur->iPage==0 ){
        pCur->eState = CURSOR_INVALID;
        *pRes = 1;
        return SQLITE_OK;
      }
      moveToParent(pCur);
    }
    pCur->info.nSize = 0;
    pCur->validNKey = 0;

    pCur->aiIdx[pCur->iPage]--;
    pPage = pCur->apPage[pCur->iPage];
    if( pPage->intKey && !pPage->leaf ){
      rc = sqlite3BtreePrevious(pCur, pRes);
    }else{
      rc = SQLITE_OK;
    }
  }
  *pRes = 0;
  return rc;
}